

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_bgr2rgba(Mat *m,uchar *rgba,int stride)

{
  int *piVar1;
  int in_EDX;
  undefined1 *in_RSI;
  long *in_RDI;
  int remain;
  int y;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  int local_334 [3];
  int local_328 [3];
  int local_31c [3];
  int local_310;
  int local_30c;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  long local_2e8;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined8 local_2c8;
  float *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined8 local_278;
  float *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined4 local_250;
  long local_248;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined8 local_228;
  float *local_220;
  int local_218;
  int local_214;
  int local_210;
  undefined1 *local_208;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1d8;
  undefined8 *local_1c8;
  undefined8 *local_1b8;
  undefined1 local_195;
  undefined4 local_194;
  undefined8 *local_188;
  long local_178;
  undefined4 local_16c;
  long local_168;
  float *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  undefined4 local_13c;
  long local_138;
  undefined1 local_115;
  undefined4 local_114;
  undefined8 *local_108;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined1 local_95;
  undefined4 local_94;
  undefined8 *local_88;
  long local_78;
  undefined4 local_6c;
  long local_68;
  float *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_210 = *(int *)((long)in_RDI + 0x2c);
  local_214 = (int)in_RDI[6];
  local_218 = in_EDX + local_210 * -4;
  if (local_218 == 0) {
    local_210 = local_210 * local_214;
    local_214 = 1;
  }
  local_88 = &local_268;
  local_4c = *(int *)((long)in_RDI + 0x2c);
  local_50 = (int)in_RDI[6];
  local_54 = *(undefined4 *)((long)in_RDI + 0x34);
  local_220 = (float *)*in_RDI;
  local_68 = in_RDI[2];
  local_6c = (undefined4)in_RDI[3];
  local_78 = in_RDI[4];
  local_48 = &local_268;
  local_38 = (long)local_4c * (long)local_50 * local_68;
  local_8 = &local_268;
  local_1f8 = &local_268;
  local_108 = &local_2b8;
  local_cc = *(int *)((long)in_RDI + 0x2c);
  local_d0 = (int)in_RDI[6];
  local_d4 = *(undefined4 *)((long)in_RDI + 0x34);
  local_270 = (float *)(*in_RDI + in_RDI[8] * in_RDI[2]);
  local_e8 = in_RDI[2];
  local_ec = (undefined4)in_RDI[3];
  local_f8 = in_RDI[4];
  local_c8 = &local_2b8;
  local_b8 = (long)local_cc * (long)local_d0 * local_e8;
  local_10 = &local_2b8;
  local_1f0 = &local_2b8;
  local_188 = &local_308;
  local_14c = *(int *)((long)in_RDI + 0x2c);
  local_150 = (int)in_RDI[6];
  local_154 = *(undefined4 *)((long)in_RDI + 0x34);
  local_2c0 = (float *)(*in_RDI + in_RDI[8] * 2 * in_RDI[2]);
  local_168 = in_RDI[2];
  local_16c = (undefined4)in_RDI[3];
  local_178 = in_RDI[4];
  local_148 = &local_308;
  local_138 = (long)local_14c * (long)local_150 * local_168;
  local_18 = &local_308;
  local_1e8 = &local_308;
  local_230 = 0;
  local_234 = 0;
  local_238 = 0;
  local_23c = 0;
  local_250 = 0;
  local_258 = 0;
  local_260 = 0;
  local_268 = 0;
  local_280 = 0;
  local_284 = 0;
  local_288 = 0;
  local_28c = 0;
  local_2a0 = 0;
  local_2a8 = 0;
  local_2b0 = 0;
  local_2b8 = 0;
  local_3c = 0x10;
  local_94 = 0;
  local_95 = 1;
  local_bc = 0x10;
  local_114 = 1;
  local_115 = 1;
  local_13c = 0x10;
  local_194 = 2;
  local_195 = 1;
  local_228 = 0;
  local_240 = 0;
  local_278 = 0;
  local_290 = 0;
  local_308 = 0;
  local_2f8 = 0;
  local_2f0 = 0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d4 = 0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_300 = 0;
  local_208 = in_RSI;
  local_1d8 = local_1e8;
  local_1c8 = local_1f0;
  local_1b8 = local_1f8;
  local_160 = local_2c0;
  local_e0 = local_270;
  local_60 = local_220;
  local_2e8 = local_178;
  local_298 = local_f8;
  local_248 = local_78;
  for (local_30c = 0; local_30c < local_214; local_30c = local_30c + 1) {
    for (local_310 = local_210; 0 < local_310; local_310 = local_310 + -1) {
      local_31c[2] = (int)*local_2c0;
      local_31c[1] = 0;
      piVar1 = std::max<int>(local_31c + 2,local_31c + 1);
      local_31c[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_31c);
      *local_208 = (char)*piVar1;
      local_328[2] = (int)*local_270;
      local_328[1] = 0;
      piVar1 = std::max<int>(local_328 + 2,local_328 + 1);
      local_328[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_328);
      local_208[1] = (char)*piVar1;
      local_334[2] = (int)*local_220;
      local_334[1] = 0;
      piVar1 = std::max<int>(local_334 + 2,local_334 + 1);
      local_334[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_334);
      local_208[2] = (char)*piVar1;
      local_208[3] = 0xff;
      local_208 = local_208 + 4;
      local_220 = local_220 + 1;
      local_270 = local_270 + 1;
      local_2c0 = local_2c0 + 1;
    }
    local_208 = local_208 + local_218;
  }
  return;
}

Assistant:

static void to_bgr2rgba(const Mat& m, unsigned char* rgba, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 4;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);

    for (int y = 0; y < h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
        uint8x8_t _a = vdup_n_u8(255);
        for (; nn > 0; nn--)
        {
            float32x4_t _rlow = vld1q_f32(ptr2);
            float32x4_t _rhigh = vld1q_f32(ptr2 + 4);
            float32x4_t _glow = vld1q_f32(ptr1);
            float32x4_t _ghigh = vld1q_f32(ptr1 + 4);
            float32x4_t _blow = vld1q_f32(ptr0);
            float32x4_t _bhigh = vld1q_f32(ptr0 + 4);

            int16x8_t _r16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_rlow)), vmovn_s32(vcvtq_s32_f32(_rhigh)));
            int16x8_t _g16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_glow)), vmovn_s32(vcvtq_s32_f32(_ghigh)));
            int16x8_t _b16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_blow)), vmovn_s32(vcvtq_s32_f32(_bhigh)));

            uint8x8x4_t _rgba;
            _rgba.val[0] = vqmovun_s16(_r16);
            _rgba.val[1] = vqmovun_s16(_g16);
            _rgba.val[2] = vqmovun_s16(_b16);
            _rgba.val[3] = _a;

            vst4_u8(rgba, _rgba);

            rgba += 4 * 8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
        }
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            rgba[0] = SATURATE_CAST_UCHAR(*ptr2);
            rgba[1] = SATURATE_CAST_UCHAR(*ptr1);
            rgba[2] = SATURATE_CAST_UCHAR(*ptr0);
            rgba[3] = 255;

            rgba += 4;
            ptr0++;
            ptr1++;
            ptr2++;
        }

#undef SATURATE_CAST_UCHAR
        rgba += wgap;
    }
}